

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O1

void __thiscall
Imf_2_5::TypedDeepImageChannel<half>::moveSamplesToNewBuffer
          (TypedDeepImageChannel<half> *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  uint uVar1;
  uint uVar2;
  half *phVar3;
  size_t sVar4;
  half **pphVar5;
  half *phVar6;
  half *phVar7;
  size_t sVar8;
  SampleCountChannel *pSVar9;
  half *phVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  
  phVar3 = this->_sampleBuffer;
  pSVar9 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  uVar11 = 0xffffffffffffffff;
  if (-1 < (long)pSVar9->_sampleBufferSize) {
    uVar11 = pSVar9->_sampleBufferSize * 2;
  }
  phVar10 = (half *)operator_new__(uVar11);
  this->_sampleBuffer = phVar10;
  sVar4 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  if (sVar4 != 0) {
    sVar12 = 0;
    do {
      pphVar5 = this->_sampleListPointers;
      phVar6 = this->_sampleBuffer;
      phVar7 = pphVar5[sVar12];
      sVar8 = newSampleListPositions[sVar12];
      phVar10 = phVar6 + sVar8;
      uVar1 = oldNumSamples[sVar12];
      uVar11 = (ulong)uVar1;
      uVar2 = newNumSamples[sVar12];
      if (uVar2 < uVar1) {
        if ((ulong)uVar2 != 0) {
          uVar11 = 0;
          do {
            phVar10[uVar11]._h = phVar7[uVar11]._h;
            uVar11 = uVar11 + 1;
          } while (uVar2 != uVar11);
        }
      }
      else {
        if (uVar11 != 0) {
          uVar13 = 0;
          do {
            phVar10[uVar13]._h = phVar7[uVar13]._h;
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
        if (uVar1 < uVar2) {
          memset(phVar6 + sVar8 + uVar11,0,(ulong)(~uVar1 + uVar2) * 2 + 2);
        }
      }
      pphVar5[sVar12] = phVar10;
      sVar12 = sVar12 + 1;
    } while (sVar12 != sVar4);
  }
  if (phVar3 == (half *)0x0) {
    return;
  }
  operator_delete__(phVar3);
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSamplesToNewBuffer
    (const unsigned int * oldNumSamples,
     const unsigned int * newNumSamples,
     const size_t * newSampleListPositions)
{
    //
    // Allocate a new sample buffer for this channel.
    // Copy the sample lists for all pixels into the new buffer.
    // Then delete the old sample buffer.
    //
    // oldNumSamples            Number of samples in each sample list in the
    //                          old sample buffer.
    //
    // newNumSamples            Number of samples in each sample list in
    //                          the new sample buffer.  If the new number
    //                          of samples is larger than the old number of
    //                          samples for a given sample list, then the
    //                          end of the new sample list is filled with
    //                          zeroes.  If the new number of samples is
    //                          smaller than the old one, then samples at
    //                          the end of the old sample list are discarded.
    //
    // newSampleListPositions   The positions of the new sample lists in the
    //                          new sample buffer.
    //

    T * oldSampleBuffer = _sampleBuffer;
    _sampleBuffer = new T [sampleCounts().sampleBufferSize()];

    for (size_t i = 0; i < numPixels(); ++i)
    {
        T * oldSampleList = _sampleListPointers[i];
        T * newSampleList = _sampleBuffer + newSampleListPositions[i];

        if (oldNumSamples[i] > newNumSamples[i])
        {
            for (unsigned int j = 0; j < newNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];
        }
        else
        {
            for (unsigned int j = 0; j < oldNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];

            for (unsigned int j = oldNumSamples[i]; j < newNumSamples[i]; ++j)
                newSampleList[j] = 0;
        }

        _sampleListPointers[i] = newSampleList;
    }

    delete [] oldSampleBuffer;
}